

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_switch_Dyy_unconditional_opt
               (response_layer *layer,integral_image *iimage)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  int iVar14;
  float *pfVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  float *pfVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  float *pfVar28;
  float *pfVar29;
  long lVar30;
  float *pfVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  bool *pbVar35;
  float *pfVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  float *data;
  uint uVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  float fVar48;
  float local_188 [8];
  float *local_168;
  bool *local_160;
  integral_image *local_130;
  float *data_3;
  long local_c8;
  float *local_a0;
  float *local_98;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_68;
  float *local_58;
  float *local_50;
  int local_34;
  
  iVar14 = iimage->height;
  iVar8 = layer->filter_size;
  if (iVar8 <= iVar14) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer,iimage);
    return;
  }
  uVar2 = iimage->width;
  uVar18 = iVar8 / 3;
  uVar37 = (iVar8 + -1) - (iVar8 + -1 >> 0x1f) >> 1;
  if (iVar14 <= (int)uVar37) {
    iVar13 = iimage->data_width;
    lVar30 = (long)iVar13;
    pfVar17 = iimage->data;
    iVar33 = layer->height;
    iVar38 = layer->step;
    lVar46 = (long)iVar38;
    local_168 = layer->response;
    fVar48 = 1.0 / (float)(iVar8 * iVar8);
    local_160 = layer->laplacian;
    if ((int)uVar18 < (int)uVar2) {
      lVar30 = -0x188 - ((ulong)uVar2 * 4 + 0xf & 0xfffffffffffffff0);
      local_34 = layer->width * iVar38;
      iVar13 = (iVar14 + -1) * iVar13;
      uVar20 = local_34 - uVar18;
      local_130 = iimage;
      local_c8 = lVar46;
      if (uVar20 == 0 || local_34 < (int)uVar18) {
        lVar22 = 0;
      }
      else {
        lVar22 = 0;
        do {
          *(float *)((long)local_188 + lVar22 * 4 + lVar30 + 0x188) =
               pfVar17[(int)((uVar18 - 1) + iVar13 + (int)lVar22)];
          lVar22 = lVar22 + lVar46;
        } while (lVar22 < (long)(ulong)uVar20);
      }
      fVar1 = pfVar17[(int)((uVar2 - 1) + iVar13)];
      if ((int)lVar22 < (int)uVar18) {
        lVar22 = (long)(int)lVar22;
        do {
          *(float *)((long)local_188 + lVar22 * 4 + lVar30 + 0x188) = fVar1;
          lVar22 = lVar22 + lVar46;
        } while (lVar22 < (int)uVar18);
      }
      lVar23 = (long)local_34;
      iVar14 = (int)lVar22;
      if (iVar14 < local_34) {
        lVar22 = (long)iVar14;
        iVar14 = (iVar13 + iVar14) - uVar18;
        do {
          lVar16 = (long)iVar14;
          iVar14 = iVar14 + iVar38;
          *(float *)((long)local_188 + lVar22 * 4 + lVar30 + 0x188) = fVar1 - pfVar17[lVar16];
          lVar22 = lVar22 + lVar46;
        } while (lVar22 < lVar23);
      }
      iVar33 = iVar33 * iVar38;
      if (0 < iVar33) {
        iVar41 = uVar18 - 1;
        lVar46 = (long)(int)uVar18;
        uVar20 = ~uVar18;
        uVar2 = iVar8 / 6;
        uVar44 = ~uVar2;
        iVar45 = iVar41 - uVar2;
        uVar11 = ~(long)(int)uVar2;
        iVar14 = -uVar18;
        uVar24 = lVar46 * 4 ^ 0xfffffffffffffffc;
        iVar8 = 0;
        iVar38 = -1;
        iVar13 = 0;
        do {
          iVar21 = (int)local_c8;
          if (0 < local_34) {
            iVar3 = local_130->data_width;
            pfVar19 = local_130->data;
            lVar25 = (long)(iVar3 * iVar38);
            lVar22 = (long)(int)(iVar3 * uVar18);
            lVar16 = (long)(iVar3 * iVar13);
            lVar43 = (long)(iVar3 * iVar41);
            lVar34 = (long)(int)(iVar3 * uVar20);
            lVar40 = (long)(iVar3 * iVar14);
            pfVar17 = local_168 + iVar8;
            pbVar35 = local_160 + iVar8;
            iVar42 = iVar3 * iVar41 + ~uVar37;
            iVar39 = iVar3 * iVar14 + ~uVar37;
            lVar26 = 0;
            do {
              auVar7 = vfmadd213ss_fma(ZEXT416((uint)((pfVar19[((int)(iVar3 * uVar44) + lVar26) -
                                                               lVar46] -
                                                      pfVar19[(iVar3 * iVar45 + lVar26) - lVar46]) +
                                                     (pfVar19[lVar46 + (long)(iVar3 * iVar45) +
                                                                       lVar26 + -2] -
                                                     pfVar19[lVar46 + (long)(int)(iVar3 * uVar44) +
                                                                      lVar26 + -2]))),
                                       SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416(*(uint *)((long)local_188 +
                                                        lVar26 * 4 + lVar30 + 0x188)));
              fVar1 = fVar48 * auVar7._0_4_;
              auVar7 = vfmadd213ss_fma(ZEXT416((uint)((pfVar19[uVar11 + lVar40 + lVar26] -
                                                      pfVar19[uVar11 + lVar43 + lVar26]) +
                                                     (pfVar19[uVar11 + lVar46 + lVar43 + lVar26] -
                                                     pfVar19[uVar11 + lVar46 + lVar40 + lVar26]))),
                                       SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416((uint)((pfVar19[iVar39] - pfVar19[iVar42]) +
                                                     (pfVar19[(long)(int)uVar37 + lVar43 + lVar26] -
                                                     pfVar19[(long)(int)uVar37 + lVar40 + lVar26])))
                                      );
              fVar5 = fVar48 * auVar7._0_4_;
              fVar6 = fVar48 * ((((pfVar19[lVar34 + lVar26] - pfVar19[lVar25 + lVar26]) +
                                  (pfVar19[lVar46 + lVar25 + lVar26] -
                                  pfVar19[lVar46 + lVar34 + lVar26]) +
                                 (pfVar19[lVar22 + lVar26 + -1] - pfVar19[lVar16 + lVar26 + -1]) +
                                 (*(float *)((long)pfVar19 + lVar26 * 4 + lVar16 * 4 + uVar24) -
                                 *(float *)((long)pfVar19 + lVar26 * 4 + lVar22 * 4 + uVar24))) -
                                ((pfVar19[lVar25 + lVar26 + -1] - pfVar19[lVar34 + lVar26 + -1]) +
                                (*(float *)((long)pfVar19 + lVar26 * 4 + lVar34 * 4 + uVar24) -
                                *(float *)((long)pfVar19 + lVar26 * 4 + lVar25 * 4 + uVar24)))) -
                               ((pfVar19[lVar46 + lVar22 + lVar26] -
                                pfVar19[lVar46 + lVar16 + lVar26]) +
                               (pfVar19[lVar16 + lVar26] - pfVar19[lVar22 + lVar26])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6 * -0.81)),ZEXT416((uint)fVar5),
                                       ZEXT416((uint)fVar1));
              *pfVar17 = auVar7._0_4_;
              *pbVar35 = 0.0 <= fVar1 + fVar5;
              lVar26 = lVar26 + local_c8;
              pfVar17 = pfVar17 + 1;
              pbVar35 = pbVar35 + 1;
              iVar8 = iVar8 + 1;
              iVar42 = iVar42 + iVar21;
              iVar39 = iVar39 + iVar21;
            } while (lVar26 < lVar23);
          }
          iVar14 = iVar14 + iVar21;
          iVar13 = iVar13 + iVar21;
          uVar18 = uVar18 + iVar21;
          iVar38 = iVar38 + iVar21;
          uVar20 = uVar20 + iVar21;
          iVar41 = iVar41 + iVar21;
          iVar45 = iVar45 + iVar21;
          uVar44 = uVar44 + iVar21;
        } while (iVar13 < iVar33);
      }
    }
    else {
      iVar41 = layer->width * iVar38;
      uVar20 = iVar8 / 6;
      uVar11 = (ulong)(int)uVar18;
      fVar1 = pfVar17[(int)((iVar14 + -1) * iVar13 + -1 + uVar2)];
      lVar22 = (long)iVar41;
      lVar23 = (long)(int)uVar20;
      if (iVar41 - uVar20 == 0 || iVar41 < (int)uVar20) {
        iVar14 = 0;
        lVar16 = 0;
      }
      else {
        lVar16 = lVar30 * uVar11;
        pfVar29 = pfVar17 + -lVar30;
        lVar26 = (uVar11 - 1) * lVar30;
        pfVar19 = pfVar17 + ~uVar11 * lVar30;
        pfVar36 = pfVar17 + (uVar11 - lVar30);
        pfVar28 = pfVar17 + ~uVar11 * lVar30 + uVar11;
        pfVar15 = pfVar17 + lVar16;
        local_68 = pfVar17 + ((lVar26 + -1) - lVar23);
        pfVar9 = pfVar17 + ((int)uVar37 - lVar16);
        local_88 = (float *)((lVar30 * -4 + 4) * uVar11 + lVar23 * -4 + -4 + (long)pfVar17);
        lVar25 = (lVar23 * 4 + lVar16 * 4 ^ 0xfffffffffffffffcU) + (long)pfVar17;
        lVar34 = lVar46 * lVar30;
        pfVar31 = pfVar17 + lVar26 + (int)uVar37;
        local_98 = pfVar17 + ((lVar26 + (uVar11 - 1)) - lVar23);
        iVar14 = 0;
        local_a0 = (float *)((lVar30 * 4 + 4) * uVar11 + (long)pfVar17);
        local_80 = pfVar17 + uVar11;
        lVar16 = 0;
        pfVar12 = pfVar17;
        do {
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar17[(int)((uVar18 + ~uVar20 + (int)lVar16) *
                                                               iVar13 + (uVar2 - 1))]),
                                   SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar41) {
            fVar5 = fVar48 * auVar7._0_4_;
            pfVar10 = local_168 + iVar14;
            pbVar35 = local_160 + iVar14;
            lVar26 = 0;
            uVar44 = ~uVar18;
            uVar32 = ~uVar37;
            do {
              auVar7 = vfmadd132ss_fma(ZEXT416((uint)((local_98[lVar26] -
                                                      *(float *)((long)local_88 + lVar26 * 4)) +
                                                     (*(float *)(lVar25 + lVar26 * 4) -
                                                     local_68[lVar26]))),
                                       ZEXT416((uint)((pfVar17[(lVar16 - uVar11) * lVar30 +
                                                               (long)(int)uVar32] -
                                                      pfVar17[(lVar16 + -1 + uVar11) * lVar30 +
                                                              (long)(int)uVar32]) +
                                                     (pfVar31[lVar26] - pfVar9[lVar26]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              fVar6 = fVar48 * auVar7._0_4_;
              fVar4 = fVar48 * ((((pfVar17[lVar16 * lVar30 + (long)(int)uVar44] -
                                  pfVar17[(lVar16 + uVar11) * lVar30 + (long)(int)uVar44]) +
                                  (pfVar15[lVar26 + -1] - pfVar12[lVar26 + -1]) +
                                 (pfVar36[lVar26] - pfVar28[lVar26]) +
                                 (pfVar19[lVar26] - pfVar29[lVar26])) -
                                ((pfVar17[((lVar16 - uVar11) + -1) * lVar30 + (long)(int)uVar44] -
                                 pfVar17[(lVar16 + -1) * lVar30 + (long)(int)uVar44]) +
                                (pfVar29[lVar26 + -1] - pfVar19[lVar26 + -1]))) -
                               ((pfVar12[lVar26] - pfVar15[lVar26]) +
                               (local_a0[lVar26] - local_80[lVar26])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * -0.81 * fVar4)),ZEXT416((uint)fVar6),
                                       ZEXT416((uint)fVar5));
              *pfVar10 = auVar7._0_4_;
              *pbVar35 = 0.0 <= fVar5 + fVar6;
              lVar26 = lVar26 + lVar46;
              pfVar10 = pfVar10 + 1;
              pbVar35 = pbVar35 + 1;
              iVar14 = iVar14 + 1;
              uVar32 = uVar32 + iVar38;
              uVar44 = uVar44 + iVar38;
            } while (lVar26 < lVar22);
          }
          local_68 = local_68 + lVar34;
          pfVar15 = pfVar15 + lVar34;
          pfVar12 = pfVar12 + lVar34;
          pfVar29 = pfVar29 + lVar34;
          pfVar19 = pfVar19 + lVar34;
          lVar16 = lVar16 + lVar46;
          lVar25 = lVar25 + lVar34 * 4;
          local_a0 = local_a0 + lVar34;
          local_80 = local_80 + lVar34;
          local_98 = local_98 + lVar34;
          local_88 = (float *)((long)local_88 + lVar34 * 4);
          pfVar9 = pfVar9 + lVar34;
          pfVar31 = pfVar31 + lVar34;
          pfVar28 = pfVar28 + lVar34;
          pfVar36 = pfVar36 + lVar34;
        } while (lVar16 < (long)(ulong)(iVar41 - uVar20));
      }
      fVar1 = fVar1 * -2.0;
      lVar25 = (long)(int)(uVar20 + 1);
      if ((int)lVar16 <= (int)uVar20) {
        lVar47 = lVar46 * lVar30;
        lVar16 = (long)(int)lVar16;
        fVar5 = fVar48 * fVar1;
        lVar27 = (lVar16 - uVar11) * lVar30;
        lVar26 = (lVar16 + uVar11) * lVar30;
        lVar40 = (lVar16 + -1 + uVar11) * lVar30;
        pfVar19 = pfVar17 + lVar16 * lVar30;
        lVar43 = (lVar16 + -1) * lVar30;
        local_50 = pfVar17 + lVar26;
        lVar34 = ((lVar16 + -1) - uVar11) * lVar30;
        local_58 = pfVar17 + lVar26 + uVar11;
        pfVar29 = pfVar17 + (lVar40 - lVar25);
        pfVar28 = pfVar17 + (lVar27 - lVar25);
        pfVar9 = pfVar17 + ((lVar27 + uVar11) - lVar25);
        local_68 = pfVar17 + lVar43;
        local_98 = pfVar17 + lVar16 * lVar30 + uVar11;
        pfVar15 = pfVar17 + lVar34;
        local_80 = pfVar17 + lVar34 + uVar11;
        local_88 = pfVar17 + lVar43 + uVar11;
        pfVar31 = pfVar17 + lVar40 + (int)uVar37;
        pfVar36 = pfVar17 + lVar27 + (int)uVar37;
        pfVar12 = pfVar17 + ((lVar40 + uVar11) - lVar25);
        do {
          if (0 < iVar41) {
            lVar26 = 0;
            pfVar10 = local_168 + iVar14;
            pbVar35 = local_160 + iVar14;
            uVar44 = ~uVar37;
            uVar32 = ~uVar18;
            do {
              auVar7 = vfmadd132ss_fma(ZEXT416((uint)((pfVar12[lVar26] - pfVar9[lVar26]) +
                                                     (pfVar28[lVar26] - pfVar29[lVar26]))),
                                       ZEXT416((uint)((pfVar17[(lVar16 - uVar11) * lVar30 +
                                                               (long)(int)uVar44] -
                                                      pfVar17[(lVar16 + -1 + uVar11) * lVar30 +
                                                              (long)(int)uVar44]) +
                                                     (pfVar31[lVar26] - pfVar36[lVar26]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              fVar6 = fVar48 * auVar7._0_4_;
              fVar4 = fVar48 * ((((pfVar17[lVar16 * lVar30 + (long)(int)uVar32] -
                                  pfVar17[(lVar16 + uVar11) * lVar30 + (long)(int)uVar32]) +
                                  (local_50[lVar26 + -1] - pfVar19[lVar26 + -1]) +
                                 (local_88[lVar26] - local_80[lVar26]) +
                                 (pfVar15[lVar26] - local_68[lVar26])) -
                                ((pfVar17[((lVar16 - uVar11) + -1) * lVar30 + (long)(int)uVar32] -
                                 pfVar17[(lVar16 + -1) * lVar30 + (long)(int)uVar32]) +
                                (local_68[lVar26 + -1] - pfVar15[lVar26 + -1]))) -
                               ((pfVar19[lVar26] - local_50[lVar26]) +
                               (local_58[lVar26] - local_98[lVar26])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * -0.81 * fVar4)),ZEXT416((uint)fVar6),
                                       ZEXT416((uint)fVar5));
              *pfVar10 = auVar7._0_4_;
              *pbVar35 = 0.0 <= fVar5 + fVar6;
              lVar26 = lVar26 + lVar46;
              pfVar10 = pfVar10 + 1;
              pbVar35 = pbVar35 + 1;
              iVar14 = iVar14 + 1;
              uVar44 = uVar44 + iVar38;
              uVar32 = uVar32 + iVar38;
            } while (lVar26 < lVar22);
          }
          local_50 = local_50 + lVar47;
          local_68 = local_68 + lVar47;
          local_58 = local_58 + lVar47;
          lVar16 = lVar16 + lVar46;
          pfVar19 = pfVar19 + lVar47;
          pfVar15 = pfVar15 + lVar47;
          local_98 = local_98 + lVar47;
          local_88 = local_88 + lVar47;
          local_80 = local_80 + lVar47;
          pfVar29 = pfVar29 + lVar47;
          pfVar28 = pfVar28 + lVar47;
          pfVar31 = pfVar31 + lVar47;
          pfVar36 = pfVar36 + lVar47;
          pfVar12 = pfVar12 + lVar47;
          pfVar9 = pfVar9 + lVar47;
        } while (lVar16 <= lVar23);
      }
      iVar33 = iVar33 * iVar38;
      if ((int)lVar16 < iVar33) {
        lVar43 = lVar46 * lVar30;
        lVar23 = (long)(int)lVar16;
        lVar16 = (lVar23 + uVar11) * lVar30;
        lVar26 = (lVar23 + -1 + uVar11) * lVar30;
        pfVar31 = pfVar17 + lVar26 + (int)uVar37;
        lVar34 = (lVar23 - uVar11) * lVar30;
        pfVar12 = pfVar17 + lVar34 + (int)uVar37;
        pfVar36 = pfVar17 + (lVar34 - lVar25);
        lVar40 = (lVar23 + -1) * lVar30;
        pfVar19 = pfVar17 + lVar16;
        local_58 = pfVar17 + lVar23 * lVar30;
        pfVar28 = pfVar17 + lVar16 + uVar11;
        lVar16 = ((lVar23 + -1) - uVar11) * lVar30;
        local_78 = pfVar17 + lVar40;
        local_68 = pfVar17 + lVar16;
        local_50 = pfVar17 + lVar23 * lVar30 + uVar11;
        pfVar9 = pfVar17 + lVar40 + uVar11;
        local_88 = pfVar17 + (lVar26 - lVar25);
        local_80 = pfVar17 + lVar16 + uVar11;
        pfVar29 = pfVar17 + ((lVar34 + uVar11) - lVar25);
        pfVar15 = pfVar17 + ((lVar26 + uVar11) - lVar25);
        do {
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)pfVar17[(int)((~uVar20 + (int)lVar23) * iVar13 +
                                                              (uVar2 - 1))]),
                                   SUB6416(ZEXT464(0x40400000),0),ZEXT416((uint)fVar1));
          if (0 < iVar41) {
            fVar5 = fVar48 * auVar7._0_4_;
            lVar16 = 0;
            pfVar10 = local_168 + iVar14;
            pbVar35 = local_160 + iVar14;
            uVar32 = ~uVar37;
            uVar44 = ~uVar18;
            do {
              auVar7 = vfmadd132ss_fma(ZEXT416((uint)((pfVar36[lVar16] - local_88[lVar16]) +
                                                     (pfVar15[lVar16] - pfVar29[lVar16]))),
                                       ZEXT416((uint)((pfVar31[lVar16] - pfVar12[lVar16]) +
                                                     (pfVar17[(lVar23 - uVar11) * lVar30 +
                                                              (long)(int)uVar32] -
                                                     pfVar17[(lVar23 + -1 + uVar11) * lVar30 +
                                                             (long)(int)uVar32]))),
                                       SUB6416(ZEXT464(0xc0400000),0));
              fVar6 = auVar7._0_4_ * fVar48;
              fVar4 = fVar48 * ((((pfVar17[lVar23 * lVar30 + (long)(int)uVar44] -
                                  pfVar17[(lVar23 + uVar11) * lVar30 + (long)(int)uVar44]) +
                                  (pfVar19[lVar16 + -1] - local_58[lVar16 + -1]) +
                                 (pfVar9[lVar16] - local_80[lVar16]) +
                                 (local_68[lVar16] - local_78[lVar16])) -
                                ((pfVar17[((lVar23 - uVar11) + -1) * lVar30 + (long)(int)uVar44] -
                                 pfVar17[(lVar23 + -1) * lVar30 + (long)(int)uVar44]) +
                                (local_78[lVar16 + -1] - local_68[lVar16 + -1]))) -
                               ((local_58[lVar16] - pfVar19[lVar16]) +
                               (pfVar28[lVar16] - local_50[lVar16])));
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * -0.81 * fVar4)),ZEXT416((uint)fVar6),
                                       ZEXT416((uint)fVar5));
              *pfVar10 = auVar7._0_4_;
              *pbVar35 = 0.0 <= fVar6 + fVar5;
              lVar16 = lVar16 + lVar46;
              pfVar10 = pfVar10 + 1;
              pbVar35 = pbVar35 + 1;
              iVar14 = iVar14 + 1;
              uVar32 = uVar32 + iVar38;
              uVar44 = uVar44 + iVar38;
            } while (lVar16 < lVar22);
          }
          local_58 = local_58 + lVar43;
          local_78 = local_78 + lVar43;
          local_68 = local_68 + lVar43;
          local_50 = local_50 + lVar43;
          lVar23 = lVar23 + lVar46;
          pfVar19 = pfVar19 + lVar43;
          local_88 = local_88 + lVar43;
          local_80 = local_80 + lVar43;
          pfVar36 = pfVar36 + lVar43;
          pfVar31 = pfVar31 + lVar43;
          pfVar12 = pfVar12 + lVar43;
          pfVar28 = pfVar28 + lVar43;
          pfVar9 = pfVar9 + lVar43;
          pfVar15 = pfVar15 + lVar43;
          pfVar29 = pfVar29 + lVar43;
        } while (lVar23 < iVar33);
      }
    }
    return;
  }
  if (SBORROW4(uVar2,uVar18 * 2) == (int)(uVar2 + uVar18 * -2) < 0) {
    height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
    return;
  }
  height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
  return;
}

Assistant:

void compute_response_layer_switch_Dyy_unconditional_opt(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional

        optimization:
        - box_integral_unconditional_opt instead of box_integral_unconditional
        - scalar replacement for more optimal flops count
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

    } else {
        // 2. Case The filter is somewhat larger than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image. Blue lines edition brings the switch into Dyy
            // Idea: Do compute_response_layer_Dyy_leftcorner
            // but everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO: fix this

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width*step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {
                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height * step; x += step) {

                    // precompute
                    t0 = x - lobe;
                    t1 = x + lobe - 1;
                    t2 = lobe/2 + 1;
                    t3 = x - 1;
                    t5 = x - lobe - 1;
                    t7 = x + lobe;
                    t9 = x - lobe / 2 - 1;

                    for (y = 0; y < width * step; y += step) {
                        // box_integral_unconditional precompute
                        t4 = y - 1;
                        t6 = y - lobe - 1;
                        t8 = y + lobe;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

                        // Compute Dxx, Dxy
                        Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                            - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
                        Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                                + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                                - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                                - box_integral_unconditional_opt(iimage, x, y, t7, t8);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}